

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o_init.c
# Opt level: O2

int find_skates(void)

{
  objclass *poVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  
  poVar1 = objects;
  iVar3 = 0x96;
  lVar4 = -0x118;
  while( true ) {
    if (lVar4 == 0) {
      impossible("snow boots not found?");
      return -1;
    }
    if ((obj_descr[*(short *)((long)&poVar1[0x9d].oc_descr_idx + lVar4)].oc_descr != (char *)0x0) &&
       (iVar2 = strcmp(obj_descr[*(short *)((long)&poVar1[0x9d].oc_descr_idx + lVar4)].oc_descr,
                       "snow boots"), iVar2 == 0)) break;
    iVar3 = iVar3 + 1;
    lVar4 = lVar4 + 0x28;
  }
  return iVar3;
}

Assistant:

int find_skates(void)
{
    int i;
    const char *s;

    for (i = SPEED_BOOTS; i <= LEVITATION_BOOTS; i++)
	if ((s = OBJ_DESCR(objects[i])) != 0 && !strcmp(s, "snow boots"))
	    return i;

    impossible("snow boots not found?");
    return -1;	/* not 0, or caller would try again each move */
}